

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void setpause(global_State *g)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (99 < g->GCestimate) {
    uVar2 = g->GCestimate / 100;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar4 = (ulong)g->gcpause * 4;
    lVar3 = uVar2 * uVar4;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <= uVar4) {
      lVar3 = 0x7fffffffffffffff;
    }
    uVar2 = (g->GCdebt + g->totalbytes) - lVar3;
    luaE_setdebt(g,(long)uVar2 >> 0x3f & uVar2);
    return;
  }
  __assert_fail("estimate > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x483,"void setpause(global_State *)");
}

Assistant:

static void setpause (global_State *g) {
  l_mem threshold, debt;
  int pause = getgcparam(g->gcpause);
  l_mem estimate = g->GCestimate / PAUSEADJ;  /* adjust 'estimate' */
  lua_assert(estimate > 0);
  threshold = (pause < MAX_LMEM / estimate)  /* overflow? */
            ? estimate * pause  /* no overflow */
            : MAX_LMEM;  /* overflow; truncate to maximum */
  debt = gettotalbytes(g) - threshold;
  if (debt > 0) debt = 0;
  luaE_setdebt(g, debt);
}